

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O2

void node::fill_rld(vector<int,_std::allocator<int>_> *postr_to_rld,
                   vector<int,_std::allocator<int>_> *prel_to_size,
                   vector<int,_std::allocator<int>_> *postr_to_prel,
                   vector<int,_std::allocator<int>_> *prel_to_postr,
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *prel_to_children)

{
  int *piVar1;
  pointer piVar2;
  long lVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  piVar1 = (prel_to_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (postr_to_prel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = *(long *)prel_to_children;
  piVar4 = (prel_to_postr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (postr_to_rld->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 < *piVar1; lVar6 = lVar6 + 1) {
    lVar8 = (long)piVar2[lVar6];
    if (piVar1[lVar8] == 1) {
      iVar7 = (int)lVar6;
    }
    else {
      iVar7 = piVar5[piVar4[*(int *)(*(long *)(lVar3 + 8 + lVar8 * 0x18) + -4)]];
    }
    piVar5[lVar6] = iVar7;
  }
  return;
}

Assistant:

void fill_rld(std::vector<int>& postr_to_rld,
    const std::vector<int>& prel_to_size,
    const std::vector<int>& postr_to_prel,
    const std::vector<int>& prel_to_postr,
    const std::vector<std::vector<int>>& prel_to_children) {
  // The loop iterates over right-to-left postorder.
  int preorder = 0;
  for(int i = 0; i < prel_to_size[0]; ++i) {
    preorder = postr_to_prel[i];
    if (prel_to_size[preorder] == 1) {
      postr_to_rld[i] = i;
    } else {
      postr_to_rld[i] = postr_to_rld[prel_to_postr[prel_to_children[preorder][prel_to_children[preorder].size()-1]]];
    }
  }
}